

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

size_t __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::avg_obj_size(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
               *this,size_t align)

{
  void_pointer pvVar1;
  void_pointer pvVar2;
  ulong uVar3;
  
  if ((elem_ptr_pointer)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage !=
      this->_free_elem) {
    pvVar1 = this->_begin_storage;
    pvVar2 = next_aligned_storage(this,align);
    uVar3 = ((long)this->_free_elem -
            (long)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage) / 0x28;
    return ((long)pvVar2 + uVar3 + ~(ulong)pvVar1) / uVar3;
  }
  return 0;
}

Assistant:

const_void_pointer                   storage() const noexcept { return _storage; }